

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::InitializeStackFunctions
          (InterpreterStackFrame *this,StackScriptFunction *scriptFunctions)

{
  ParseableFunctionInfo *this_00;
  uint uVar1;
  FunctionProxy *this_01;
  ScriptFunctionType *deferredPrototypeType;
  ScriptFunctionType *type;
  FunctionProxy *nestedProxy;
  StackScriptFunction *stackScriptFunction;
  uint i;
  uint nestedCount;
  FunctionBody *functionBody;
  StackScriptFunction *scriptFunctions_local;
  InterpreterStackFrame *this_local;
  
  *(StackScriptFunction **)(this + 0x48) = scriptFunctions;
  this_00 = *(ParseableFunctionInfo **)(this + 0x88);
  uVar1 = ParseableFunctionInfo::GetNestedCount(this_00);
  for (stackScriptFunction._0_4_ = 0; (uint)stackScriptFunction < uVar1;
      stackScriptFunction._0_4_ = (uint)stackScriptFunction + 1) {
    this_01 = ParseableFunctionInfo::GetNestedFunctionProxy(this_00,(uint)stackScriptFunction);
    deferredPrototypeType = FunctionProxy::EnsureDeferredPrototypeType(this_01);
    StackScriptFunction::StackScriptFunction
              (scriptFunctions + (uint)stackScriptFunction,this_01,deferredPrototypeType);
  }
  return;
}

Assistant:

void InterpreterStackFrame::InitializeStackFunctions(StackScriptFunction * scriptFunctions)
    {
        this->stackNestedFunctions = scriptFunctions;
        FunctionBody * functionBody = this->m_functionBody;
        uint nestedCount = functionBody->GetNestedCount();
        for (uint i = 0; i < nestedCount; i++)
        {
            StackScriptFunction * stackScriptFunction = scriptFunctions + i;
            FunctionProxy* nestedProxy = functionBody->GetNestedFunctionProxy(i);
            ScriptFunctionType* type = nestedProxy->EnsureDeferredPrototypeType();
            new (stackScriptFunction)StackScriptFunction(nestedProxy, type);
        }
    }